

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

void __thiscall
glcts::ExtensionDirectiveTestCaseGroup::ExtensionDirectiveTestCase::ExtensionDirectiveTestCase
          (ExtensionDirectiveTestCase *this,Context *context,GLSLVersion glslVersion,char *behaviour
          )

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  bool bVar4;
  string b;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"extension_directive_","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,(char *)local_70,"Test #extension directive.");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_0210f3a0;
  (this->super_TestCase).m_context = context;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ExtensionDirectiveTestCase_0215bb20;
  this->m_glslVersion = glslVersion;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_behaviourStr,behaviour,(allocator<char> *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,behaviour,(allocator<char> *)local_50);
  iVar1 = std::__cxx11::string::compare((char *)&local_70);
  bVar4 = iVar1 == 0;
  if (!bVar4) {
    std::__cxx11::string::compare((char *)&local_70);
  }
  this->m_requireInfoLog = bVar4;
  this->m_requireCompile = !bVar4;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  return;
}

Assistant:

ExtensionDirectiveTestCase(deqp::Context& context, glu::GLSLVersion glslVersion, const char* behaviour)
			: TestCase(context, (std::string("extension_directive_") + behaviour).c_str(), "Test #extension directive.")
			, m_glslVersion(glslVersion)
			, m_behaviourStr(behaviour)
		{
			// Initialize expected compiler behaviour.
			std::string b(behaviour);
			if (b == "disable")
			{
				m_requireInfoLog = true;
				m_requireCompile = false;
			}
			else if (b == "enable")
			{
				m_requireInfoLog = false;
				m_requireCompile = true;
			}
			else
			{
				DE_ASSERT(b == "warn");
				m_requireInfoLog = false;
				m_requireCompile = true;
			}
		}